

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O3

bool __thiscall cmFindPackageCommand::FindModule(cmFindPackageCommand *this,bool *found)

{
  pointer pcVar1;
  bool bVar2;
  string var;
  string module;
  string mfile;
  string local_88;
  long *local_68 [2];
  long local_58 [2];
  string local_48;
  
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"Find","");
  std::__cxx11::string::_M_append((char *)local_68,(ulong)(this->Name)._M_dataplus._M_p);
  std::__cxx11::string::append((char *)local_68);
  cmMakefile::GetModulesFile_abi_cxx11_
            (&local_48,(this->super_cmFindCommon).super_cmCommand.Makefile,(char *)local_68[0]);
  if (local_48._M_string_length == 0) {
    bVar2 = true;
  }
  else {
    *found = true;
    pcVar1 = (this->Name)._M_dataplus._M_p;
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,pcVar1,pcVar1 + (this->Name)._M_string_length);
    std::__cxx11::string::append((char *)&local_88);
    cmMakefile::AddDefinition((this->super_cmFindCommon).super_cmCommand.Makefile,&local_88,"1");
    bVar2 = ReadListFile(this,local_48._M_dataplus._M_p,DoPolicyScope);
    cmMakefile::RemoveDefinition((this->super_cmFindCommon).super_cmCommand.Makefile,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  return bVar2;
}

Assistant:

bool cmFindPackageCommand::FindModule(bool& found)
{
  std::string module = "Find";
  module += this->Name;
  module += ".cmake";
  std::string mfile = this->Makefile->GetModulesFile(module.c_str());
  if (!mfile.empty())
    {
    // Load the module we found, and set "<name>_FIND_MODULE" to true
    // while inside it.
    found = true;
    std::string var = this->Name;
    var += "_FIND_MODULE";
    this->Makefile->AddDefinition(var, "1");
    bool result = this->ReadListFile(mfile.c_str(), DoPolicyScope);
    this->Makefile->RemoveDefinition(var);
    return result;
    }
  return true;
}